

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)

{
  uint uVar1;
  xmlSchemaTypePtr node;
  long *plVar2;
  xmlSchemaAttributeUsePtr_conflict pxVar3;
  xmlSchemaNodeInfoPtr pxVar4;
  xmlSchemaElementPtr pxVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  xmlSchemaAttrInfoPtr pxVar10;
  xmlSchemaAttributePtr_conflict pxVar11;
  xmlSchemaAttributePtr *ppxVar12;
  xmlSchemaValPtr pxVar13;
  xmlChar *pxVar14;
  xmlNsPtr pxVar15;
  xmlAttrPtr pxVar16;
  xmlChar *pxVar17;
  xmlSchemaTypePtr pxVar18;
  char *pcVar19;
  xmlSchemaIDCStateObjPtr_conflict sto;
  long lVar20;
  xmlSchemaIDCStateObjPtr_conflict pxVar21;
  xmlParserErrors xVar22;
  xmlNodePtr node_00;
  xmlSchemaAttributePtr pxVar23;
  xmlSchemaValidCtxtPtr pxVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  xmlNodePtr node_01;
  xmlChar prefix [13];
  xmlSchemaPSVIIDCBindingPtr_conflict str2;
  xmlChar *local_40 [2];
  
  node = vctxt->inode->typeDef;
  plVar2 = (long *)node->attrUses;
  uVar1 = vctxt->nbAttrInfos;
  uVar8 = uVar1;
  if ((plVar2 != (long *)0x0) && (lVar27 = plVar2[1], 0 < (long)(int)lVar27)) {
    lVar26 = 0;
    do {
      pxVar3 = *(xmlSchemaAttributeUsePtr_conflict *)(*plVar2 + lVar26 * 8);
      pxVar23 = pxVar3->attrDecl;
      if (0 < (int)uVar1) {
        uVar25 = 0;
        do {
          pxVar10 = vctxt->attrInfos[uVar25];
          if (pxVar10->metaType == 0) {
            if (((*pxVar10->localName == *pxVar23->name) &&
                (iVar7 = xmlStrEqual(pxVar10->localName,pxVar23->name), iVar7 != 0)) &&
               (iVar7 = xmlStrEqual(pxVar10->nsName,pxVar23->targetNamespace), iVar7 != 0)) {
              pxVar10->state = 2;
              pxVar10->use = pxVar3;
              pxVar10->decl = pxVar23;
              pxVar10->typeDef = pxVar23->subtypes;
              goto LAB_001a6962;
            }
          }
          uVar25 = uVar25 + 1;
        } while (uVar1 != uVar25);
      }
      pxVar24 = vctxt;
      if (pxVar3->occurs == 2) {
        if ((pxVar3->defValue != (xmlChar *)0x0) || (pxVar23->defValue != (xmlChar *)0x0)) {
          pxVar10 = xmlSchemaGetFreshAttrInfo(vctxt);
          if (pxVar10 == (xmlSchemaAttrInfoPtr)0x0) goto LAB_001a6ef9;
          pxVar10->state = 8;
          pxVar10->use = pxVar3;
          pxVar10->decl = pxVar23;
          pxVar10->typeDef = pxVar23->subtypes;
          pxVar10->localName = pxVar23->name;
          pxVar10->nsName = pxVar23->targetNamespace;
        }
      }
      else if (pxVar3->occurs == 1) {
        pxVar10 = xmlSchemaGetFreshAttrInfo(vctxt);
        if (pxVar10 == (xmlSchemaAttrInfoPtr)0x0) {
LAB_001a6ef9:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                     "calling xmlSchemaGetFreshAttrInfo()",(xmlChar *)0x0,(xmlChar *)pxVar24);
          return -1;
        }
        pxVar10->state = 4;
        pxVar10->use = pxVar3;
        pxVar10->decl = pxVar23;
      }
LAB_001a6962:
      lVar26 = lVar26 + 1;
    } while (lVar26 != (int)lVar27);
    uVar8 = vctxt->nbAttrInfos;
  }
  if (uVar8 != 0) {
    if (0 < (int)uVar1 && node->attributeWildcard != (xmlSchemaWildcardPtr)0x0) {
      uVar25 = 0;
      bVar6 = false;
      do {
        pxVar10 = vctxt->attrInfos[uVar25];
        if ((pxVar10->state != 1) ||
           (iVar7 = xmlSchemaCheckCVCWildcardNamespace(node->attributeWildcard,pxVar10->nsName),
           iVar7 != 0)) goto LAB_001a6a92;
        iVar7 = 0xd;
        if (node->attributeWildcard->processContents == 1) {
LAB_001a6a8e:
          pxVar10->state = iVar7;
        }
        else {
          pxVar17 = pxVar10->localName;
          pxVar11 = xmlSchemaGetAttributeDecl(vctxt->schema,pxVar17,pxVar10->nsName);
          pxVar10->decl = pxVar11;
          if (pxVar11 == (xmlSchemaAttributePtr_conflict)0x0) {
            iVar7 = (uint)(node->attributeWildcard->processContents == 2) * 4 + 10;
            goto LAB_001a6a8e;
          }
          pxVar10->state = 2;
          pxVar18 = pxVar11->subtypes;
          pxVar10->typeDef = pxVar18;
          iVar7 = xmlSchemaIsDerivedFromBuiltInType(pxVar18,(int)pxVar17);
          if (iVar7 != 0) {
            if (bVar6) {
              iVar7 = 0xf;
LAB_001a6a66:
              bVar6 = true;
              goto LAB_001a6a8e;
            }
            bVar6 = true;
            if ((plVar2 != (long *)0x0) && (lVar27 = plVar2[1], 0 < (long)(int)lVar27)) {
              lVar26 = *plVar2;
              lVar20 = 0;
              do {
                iVar7 = xmlSchemaIsDerivedFromBuiltInType
                                  (*(xmlSchemaTypePtr *)
                                    (*(long *)(*(long *)(lVar26 + lVar20 * 8) + 0x18) + 0x60),
                                   (int)node);
                if (iVar7 != 0) {
                  iVar7 = 0x10;
                  goto LAB_001a6a66;
                }
                lVar20 = lVar20 + 1;
                bVar6 = true;
              } while ((int)lVar27 != lVar20);
            }
          }
        }
LAB_001a6a92:
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar1);
      uVar8 = vctxt->nbAttrInfos;
      if (uVar8 == 0) {
        return 0;
      }
    }
    if ((((vctxt->options & 1) == 0) ||
        (vctxt->elemInfos[vctxt->depth] == (xmlSchemaNodeInfoPtr)0x0)) ||
       (node_01 = vctxt->elemInfos[vctxt->depth]->node, node_01 == (xmlNodePtr)0x0)) {
      node_01 = (xmlNodePtr)0x0;
    }
    else if (node_01->doc == (_xmlDoc *)0x0) {
      node_01 = (xmlNodePtr)0x0;
    }
    if (0 < (int)uVar8) {
      lVar27 = 0;
      do {
        pxVar4 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar27];
        iVar7 = pxVar4->depth;
        if ((iVar7 == 8) || (iVar7 == 2)) {
          if (pxVar4->typeDef != (xmlSchemaTypePtr)0x0) {
            vctxt->inode = pxVar4;
            pxVar24 = vctxt;
            if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
              iVar9 = 0;
LAB_001a6be3:
              if (iVar7 != 8) {
                if (vctxt->value != (xmlSchemaValPtr)0x0) {
                  xmlSchemaFreeValue(vctxt->value);
                  vctxt->value = (xmlSchemaValPtr)0x0;
                }
                bVar6 = true;
                if (((((*(xmlSchemaAttributePtr *)&pxVar4->normVal)->flags & 0x200) == 0) &&
                    ((pxVar4->decl == (xmlSchemaElementPtr)0x0 ||
                     (((ulong)pxVar4->decl->ref & 0x200) == 0)))) && (bVar6 = false, iVar9 == 0)) {
                  pxVar18 = pxVar4->typeDef;
                  node_00 = pxVar4->node;
                  pxVar17 = pxVar4->value;
                  iVar7 = 0;
                  pxVar24 = (xmlSchemaValidCtxtPtr)0x0;
                }
                else {
                  *(byte *)&pxVar4->flags = (byte)pxVar4->flags | 0x10;
                  pxVar18 = pxVar4->typeDef;
                  node_00 = pxVar4->node;
                  pxVar17 = pxVar4->value;
                  pxVar24 = (xmlSchemaValidCtxtPtr)&pxVar4->val;
                  iVar7 = 1;
                }
                iVar7 = xmlSchemaVCheckCVCSimpleType
                                  ((xmlSchemaAbstractCtxtPtr)vctxt,node_00,pxVar18,pxVar17,
                                   (xmlSchemaValPtr *)pxVar24,1,iVar7,0);
                if (iVar7 == 0) {
                  if ((bVar6) && (pxVar4->val != (xmlSchemaValPtr)0x0)) {
                    pxVar5 = pxVar4->decl;
                    if ((pxVar5 == (xmlSchemaElementPtr)0x0) ||
                       (pxVar5->subtypes == (xmlSchemaTypePtr)0x0)) {
                      pxVar23 = (xmlSchemaAttributePtr)
                                (*(xmlSchemaAttributePtr *)&pxVar4->normVal)->defVal;
                      if (pxVar23 != (xmlSchemaAttributePtr)0x0) {
                        pxVar4->idcTable =
                             (xmlSchemaPSVIIDCBindingPtr_conflict)
                             (*(xmlSchemaAttributePtr *)&pxVar4->normVal)->defValue;
                        goto LAB_001a6e8b;
                      }
                    }
                    else {
                      pxVar23 = pxVar5->attributes;
                      if (pxVar23 != (xmlSchemaAttributePtr)0x0) {
                        pxVar4->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)pxVar5->subtypes;
LAB_001a6e8b:
                        iVar7 = xmlSchemaAreValuesEqual(pxVar4->val,(xmlSchemaValPtr)pxVar23);
                        if (iVar7 == 0) {
                          pxVar4->depth = 7;
                        }
                      }
                    }
                  }
                }
                else {
                  if (iVar7 == -1) {
                    pcVar19 = "calling xmlSchemaStreamValidateSimpleTypeValue()";
                    goto LAB_001a7140;
                  }
                  pxVar4->depth = 5;
                }
LAB_001a6ea1:
                if (iVar9 == 0) {
LAB_001a6ed9:
                  pxVar21 = vctxt->xpathStates;
                  while ((pxVar21 != (xmlSchemaIDCStateObjPtr_conflict)0x0 &&
                         (iVar7 = xmlStreamPop((xmlStreamCtxtPtr)pxVar21->xpathCtxt), iVar7 != -1)))
                  {
                    pxVar21 = pxVar21->next;
                  }
                  goto LAB_001a6ebf;
                }
                iVar7 = xmlSchemaXPathProcessHistory(vctxt,vctxt->depth + 1);
                if (iVar7 != -1) goto LAB_001a6ebf;
                goto LAB_001a70d4;
              }
              if (node_01 == (xmlNodePtr)0x0 && iVar9 == 0) goto LAB_001a6ed9;
              pxVar18 = pxVar4->decl->subtypes;
              if (pxVar18 == (xmlSchemaTypePtr)0x0) {
                pxVar18 = (xmlSchemaTypePtr)(*(xmlSchemaAttributePtr *)&pxVar4->normVal)->defValue;
                ppxVar12 = (xmlSchemaAttributePtr *)
                           &(*(xmlSchemaAttributePtr *)&pxVar4->normVal)->defVal;
              }
              else {
                ppxVar12 = &pxVar4->decl->attributes;
              }
              pxVar23 = *ppxVar12;
              pxVar4->value = (xmlChar *)pxVar18;
              pxVar4->val = (xmlSchemaValPtr)pxVar23;
              if (pxVar23 == (xmlSchemaAttributePtr)0x0) {
                pcVar19 = "default/fixed value on an attribute use was not precomputed";
LAB_001a7140:
                xmlSchemaInternalErr2
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar19,
                           (xmlChar *)0x0,(xmlChar *)pxVar24);
                goto LAB_001a714f;
              }
              pxVar13 = xmlSchemaCopyValue((xmlSchemaValPtr)pxVar23);
              pxVar4->val = pxVar13;
              if (pxVar13 != (xmlSchemaValPtr)0x0) {
                if (node_01 != (xmlNodePtr)0x0) {
                  pxVar17 = pxVar4->value;
                  pxVar14 = xmlSchemaNormalizeValue(pxVar4->typeDef,pxVar17);
                  if (pxVar14 != (xmlChar *)0x0) {
                    pxVar17 = pxVar14;
                  }
                  if (pxVar4->nsName == (xmlChar *)0x0) {
                    pxVar16 = xmlNewProp(node_01,pxVar4->localName,pxVar17);
                    if (pxVar16 == (xmlAttrPtr)0x0) {
                      xmlSchemaInternalErr2
                                ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                                 "calling xmlNewProp()",(xmlChar *)0x0,(xmlChar *)pxVar24);
                      if (pxVar14 != (xmlChar *)0x0) {
                        (*xmlFree)(pxVar14);
                      }
                      goto LAB_001a714f;
                    }
                  }
                  else {
                    pxVar15 = xmlSearchNsByHref(node_01->doc,node_01,pxVar4->nsName);
                    if (pxVar15 == (xmlNsPtr)0x0) {
                      iVar7 = 0;
                      do {
                        snprintf((char *)local_40,0xd,"p%d");
                        pxVar15 = xmlSearchNs(node_01->doc,node_01,(xmlChar *)local_40);
                        if (iVar7 == 1000) {
                          xmlSchemaInternalErr2
                                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                                     "could not compute a ns prefix for a default/fixed attribute",
                                     (xmlChar *)0x0,(xmlChar *)pxVar24);
                          if (pxVar14 != (xmlChar *)0x0) {
                            (*xmlFree)(pxVar14);
                          }
                          goto LAB_001a714f;
                        }
                        iVar7 = iVar7 + 1;
                      } while (pxVar15 != (xmlNsPtr)0x0);
                      pxVar15 = xmlNewNs(vctxt->validationRoot,pxVar4->nsName,(xmlChar *)local_40);
                    }
                    xmlNewNsProp(node_01,pxVar15,pxVar4->localName,pxVar17);
                  }
                  if (pxVar14 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar14);
                  }
                }
                goto LAB_001a6ea1;
              }
              pcVar19 = "calling xmlSchemaCopyValue()";
            }
            else {
              iVar9 = xmlSchemaXPathEvaluate(vctxt,XML_ATTRIBUTE_NODE);
              if (iVar9 != -1) {
                iVar7 = pxVar4->depth;
                goto LAB_001a6be3;
              }
LAB_001a70d4:
              pcVar19 = "calling xmlSchemaXPathEvaluate()";
            }
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar19,
                       (xmlChar *)0x0,(xmlChar *)pxVar24);
LAB_001a714f:
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
            return -1;
          }
          pxVar4->depth = 6;
        }
LAB_001a6ebf:
        lVar27 = lVar27 + 1;
      } while (lVar27 < vctxt->nbAttrInfos);
      if (0 < vctxt->nbAttrInfos) {
        lVar27 = 0;
        do {
          pxVar4 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar27];
          uVar1 = pxVar4->depth;
          if ((uVar1 < 0x12) && ((0x26004U >> (uVar1 & 0x1f) & 1) != 0))
          goto switchD_001a6f7d_caseD_2;
          vctxt->inode = pxVar4;
          switch(uVar1) {
          case 1:
            if (*(int *)&pxVar4->field_0x5c == 0) {
              if (node->attributeWildcard == (xmlSchemaWildcardPtr)0x0) {
                xVar22 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1;
              }
              else {
                xVar22 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2;
              }
              xmlSchemaIllegalAttrErr
                        ((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlSchemaAttrInfoPtr)pxVar4,
                         (xmlNodePtr)node);
            }
            break;
          case 4:
            local_40[0] = (xmlChar *)0x0;
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
            pxVar17 = xmlSchemaFormatQName
                                (local_40,(*(xmlSchemaAttributePtr *)&pxVar4->normVal)->
                                          targetNamespace,
                                 (*(xmlSchemaAttributePtr *)&pxVar4->normVal)->name);
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_4,
                                (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                "The attribute \'%s\' is required but missing",pxVar17,
                                (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            if (local_40[0] != (xmlChar *)0x0) {
              (*xmlFree)(local_40[0]);
            }
            break;
          case 6:
            xVar22 = XML_SCHEMAV_CVC_ATTRIBUTE_2;
            pcVar19 = "The type definition is absent";
            goto LAB_001a7081;
          case 7:
            pxVar17 = pxVar4->value;
            str2 = pxVar4->idcTable;
            xVar22 = XML_SCHEMAV_CVC_AU;
            pcVar19 = "The value \'%s\' does not match the fixed value constraint \'%s\'";
            goto LAB_001a7084;
          case 10:
            xVar22 = XML_SCHEMAV_CVC_WILDCARD;
            pcVar19 = 
            "No matching global attribute declaration available, but demanded by the strict wildcard"
            ;
LAB_001a7081:
            str2 = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
            pxVar17 = (xmlChar *)0x0;
LAB_001a7084:
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar22,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)0x0,pcVar19,pxVar17,(xmlChar *)str2,
                                (xmlChar *)0x0,(xmlChar *)0x0);
          }
switchD_001a6f7d_caseD_2:
          lVar27 = lVar27 + 1;
        } while (lVar27 < vctxt->nbAttrInfos);
      }
    }
    vctxt->inode = vctxt->elemInfos[vctxt->depth];
  }
  return 0;
}

Assistant:

static int
xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaTypePtr type = vctxt->inode->typeDef;
    xmlSchemaItemListPtr attrUseList;
    xmlSchemaAttributeUsePtr attrUse = NULL;
    xmlSchemaAttributePtr attrDecl = NULL;
    xmlSchemaAttrInfoPtr iattr, tmpiattr;
    int i, j, found, nbAttrs, nbUses;
    int xpathRes = 0, res, wildIDs = 0, fixed;
    xmlNodePtr defAttrOwnerElem = NULL;

    /*
    * SPEC (cvc-attribute)
    * (1) "The declaration must not be `absent` (see Missing
    * Sub-components ($5.3) for how this can fail to be
    * the case)."
    * (2) "Its {type definition} must not be absent."
    *
    * NOTE (1) + (2): This is not handled here, since we currently do not
    * allow validation against schemas which have missing sub-components.
    *
    * SPEC (cvc-complex-type)
    * (3) "For each attribute information item in the element information
    * item's [attributes] excepting those whose [namespace name] is
    * identical to http://www.w3.org/2001/XMLSchema-instance and whose
    * [local name] is one of type, nil, schemaLocation or
    * noNamespaceSchemaLocation, the appropriate case among the following
    * must be true:
    *
    */
    attrUseList = (xmlSchemaItemListPtr) type->attrUses;
    /*
    * @nbAttrs is the number of attributes present in the instance.
    */
    nbAttrs = vctxt->nbAttrInfos;
    if (attrUseList != NULL)
	nbUses = attrUseList->nbItems;
    else
	nbUses = 0;
    for (i = 0; i < nbUses; i++) {
        found = 0;
	attrUse = attrUseList->items[i];
	attrDecl = WXS_ATTRUSE_DECL(attrUse);
        for (j = 0; j < nbAttrs; j++) {
	    iattr = vctxt->attrInfos[j];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->metaType)
		continue;
	    if (iattr->localName[0] != attrDecl->name[0])
		continue;
	    if (!xmlStrEqual(iattr->localName, attrDecl->name))
		continue;
	    if (!xmlStrEqual(iattr->nsName, attrDecl->targetNamespace))
		continue;
	    found = 1;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.1) "If there is among the {attribute uses} an attribute
	    * use with an {attribute declaration} whose {name} matches
	    * the attribute information item's [local name] and whose
	    * {target namespace} is identical to the attribute information
	    * item's [namespace name] (where an `absent` {target namespace}
	    * is taken to be identical to a [namespace name] with no value),
	    * then the attribute information must be `valid` with respect
	    * to that attribute use as per Attribute Locally Valid (Use)
	    * ($3.5.4). In this case the {attribute declaration} of that
	    * attribute use is the `context-determined declaration` for the
	    * attribute information item with respect to Schema-Validity
	    * Assessment (Attribute) ($3.2.4) and
	    * Assessment Outcome (Attribute) ($3.2.5).
	    */
	    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
	    iattr->use = attrUse;
	    /*
	    * Context-determined declaration.
	    */
	    iattr->decl = attrDecl;
	    iattr->typeDef = attrDecl->subtypes;
	    break;
	}

	if (found)
	    continue;

	if (attrUse->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED) {
	    /*
	    * Handle non-existent, required attributes.
	    *
	    * SPEC (cvc-complex-type)
	    * (4) "The {attribute declaration} of each attribute use in
	    * the {attribute uses} whose {required} is true matches one
	    * of the attribute information items in the element information
	    * item's [attributes] as per clause 3.1 above."
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_ERR_MISSING;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	} else if ((attrUse->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
	    ((attrUse->defValue != NULL) ||
	     (attrDecl->defValue != NULL))) {
	    /*
	    * Handle non-existent, optional, default/fixed attributes.
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_DEFAULT;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	    tmpiattr->typeDef = attrDecl->subtypes;
	    tmpiattr->localName = attrDecl->name;
	    tmpiattr->nsName = attrDecl->targetNamespace;
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);
    /*
    * Validate against the wildcard.
    */
    if (type->attributeWildcard != NULL) {
	/*
	* SPEC (cvc-complex-type)
	* (3.2.1) "There must be an {attribute wildcard}."
	*/
	for (i = 0; i < nbAttrs; i++) {
	    iattr = vctxt->attrInfos[i];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->state != XML_SCHEMAS_ATTR_UNKNOWN)
		continue;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.2.2) "The attribute information item must be `valid` with
	    * respect to it as defined in Item Valid (Wildcard) ($3.10.4)."
	    *
	    * SPEC Item Valid (Wildcard) (cvc-wildcard)
	    * "... its [namespace name] must be `valid` with respect to
	    * the wildcard constraint, as defined in Wildcard allows
	    * Namespace Name ($3.10.4)."
	    */
	    if (xmlSchemaCheckCVCWildcardNamespace(type->attributeWildcard,
		    iattr->nsName) == 0) {
		/*
		* Handle processContents.
		*
		* SPEC (cvc-wildcard):
		* processContents | context-determined declaration:
		* "strict"          "mustFind"
		* "lax"             "none"
		* "skip"            "skip"
		*/
		if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_SKIP) {
		     /*
		    * context-determined declaration = "skip"
		    *
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		    iattr->state = XML_SCHEMAS_ATTR_WILD_SKIP;
		    continue;
		}
		/*
		* Find an attribute declaration.
		*/
		iattr->decl = xmlSchemaGetAttributeDecl(vctxt->schema,
		    iattr->localName, iattr->nsName);
		if (iattr->decl != NULL) {
		    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
		    /*
		    * SPEC (cvc-complex-type)
		    * (5) "Let [Definition:]  the wild IDs be the set of
		    * all attribute information item to which clause 3.2
		    * applied and whose `validation` resulted in a
		    * `context-determined declaration` of mustFind or no
		    * `context-determined declaration` at all, and whose
		    * [local name] and [namespace name] resolve (as
		    * defined by QName resolution (Instance) ($3.15.4)) to
		    * an attribute declaration whose {type definition} is
		    * or is derived from ID. Then all of the following
		    * must be true:"
		    */
		    iattr->typeDef = WXS_ATTR_TYPEDEF(iattr->decl);
		    if (xmlSchemaIsDerivedFromBuiltInType(
			iattr->typeDef, XML_SCHEMAS_ID)) {
			/*
			* SPEC (5.1) "There must be no more than one
			* item in `wild IDs`."
			*/
			if (wildIDs != 0) {
			    /* VAL TODO */
			    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_DUPLICATE_ID;
			    continue;
			}
			wildIDs++;
			/*
			* SPEC (cvc-complex-type)
			* (5.2) "If `wild IDs` is non-empty, there must not
			* be any attribute uses among the {attribute uses}
			* whose {attribute declaration}'s {type definition}
			* is or is derived from ID."
			*/
                        if (attrUseList != NULL) {
                            for (j = 0; j < attrUseList->nbItems; j++) {
                                if (xmlSchemaIsDerivedFromBuiltInType(
                                    WXS_ATTRUSE_TYPEDEF(attrUseList->items[j]),
                                    XML_SCHEMAS_ID)) {
                                    /* URGENT VAL TODO: implement */
                            iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_AND_USE_ID;
                                    break;
                                }
                            }
                        }
		    }
		} else if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_LAX) {
		    iattr->state = XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL;
		    /*
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		} else {
		    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL;
		}
	    }
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);

    /*
    * Get the owner element; needed for creation of default attributes.
    * This fixes bug #341337, reported by David Grohmann.
    */
    if (vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) {
	xmlSchemaNodeInfoPtr ielem = vctxt->elemInfos[vctxt->depth];
	if (ielem && ielem->node && ielem->node->doc)
	    defAttrOwnerElem = ielem->node;
    }
    /*
    * Validate values, create default attributes, evaluate IDCs.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	/*
	* VAL TODO: Note that we won't try to resolve IDCs to
	* "lax" and "skip" validated attributes. Check what to
	* do in this case.
	*/
	if ((iattr->state != XML_SCHEMAS_ATTR_ASSESSED) &&
	    (iattr->state != XML_SCHEMAS_ATTR_DEFAULT))
	    continue;
	/*
	* VAL TODO: What to do if the type definition is missing?
	*/
	if (iattr->typeDef == NULL) {
	    iattr->state = XML_SCHEMAS_ATTR_ERR_NO_TYPE;
	    continue;
	}

	ACTIVATE_ATTRIBUTE(iattr);
	fixed = 0;
	xpathRes = 0;

	if (vctxt->xpathStates != NULL) {
	    /*
	    * Evaluate IDCs.
	    */
	    xpathRes = xmlSchemaXPathEvaluate(vctxt,
		XML_ATTRIBUTE_NODE);
	    if (xpathRes == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	}

	if (iattr->state == XML_SCHEMAS_ATTR_DEFAULT) {
	    /*
	    * Default/fixed attributes.
	    * We need the value only if we need to resolve IDCs or
	    * will create default attributes.
	    */
	    if ((xpathRes) || (defAttrOwnerElem)) {
		if (iattr->use->defValue != NULL) {
		    iattr->value = (xmlChar *) iattr->use->defValue;
		    iattr->val = iattr->use->defVal;
		} else {
		    iattr->value = (xmlChar *) iattr->decl->defValue;
		    iattr->val = iattr->decl->defVal;
		}
		/*
		* IDCs will consume the precomputed default value,
		* so we need to clone it.
		*/
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"default/fixed value on an attribute use was "
			"not precomputed");
		    goto internal_error;
		}
		iattr->val = xmlSchemaCopyValue(iattr->val);
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"calling xmlSchemaCopyValue()");
		    goto internal_error;
		}
	    }
	    /*
	    * PSVI: Add the default attribute to the current element.
	    * VAL TODO: Should we use the *normalized* value? This currently
	    *   uses the *initial* value.
	    */

	    if (defAttrOwnerElem) {
		xmlChar *normValue;
		const xmlChar *value;

		value = iattr->value;
		/*
		* Normalize the value.
		*/
		normValue = xmlSchemaNormalizeValue(iattr->typeDef,
		    iattr->value);
		if (normValue != NULL)
		    value = BAD_CAST normValue;

		if (iattr->nsName == NULL) {
		    if (xmlNewProp(defAttrOwnerElem,
			iattr->localName, value) == NULL) {
			VERROR_INT("xmlSchemaVAttributesComplex",
			    "calling xmlNewProp()");
			if (normValue != NULL)
			    xmlFree(normValue);
			goto internal_error;
		    }
		} else {
		    xmlNsPtr ns;

		    ns = xmlSearchNsByHref(defAttrOwnerElem->doc,
			defAttrOwnerElem, iattr->nsName);
		    if (ns == NULL) {
			xmlChar prefix[13];
			int counter = 0;

			/*
			* Create a namespace declaration on the validation
			* root node if no namespace declaration is in scope.
			*/
			do {
			    snprintf((char *) prefix, 13, "p%d", counter++);
			    ns = xmlSearchNs(defAttrOwnerElem->doc,
				defAttrOwnerElem, BAD_CAST prefix);
			    if (counter > 1000) {
				VERROR_INT(
				    "xmlSchemaVAttributesComplex",
				    "could not compute a ns prefix for a "
				    "default/fixed attribute");
				if (normValue != NULL)
				    xmlFree(normValue);
				goto internal_error;
			    }
			} while (ns != NULL);
			ns = xmlNewNs(vctxt->validationRoot,
			    iattr->nsName, BAD_CAST prefix);
		    }
		    /*
		    * TODO:
		    * http://lists.w3.org/Archives/Public/www-xml-schema-comments/2005JulSep/0406.html
		    * If we have QNames: do we need to ensure there's a
		    * prefix defined for the QName?
		    */
		    xmlNewNsProp(defAttrOwnerElem, ns, iattr->localName, value);
		}
		if (normValue != NULL)
		    xmlFree(normValue);
	    }
	    /*
	    * Go directly to IDC evaluation.
	    */
	    goto eval_idcs;
	}
	/*
	* Validate the value.
	*/
	if (vctxt->value != NULL) {
	    /*
	    * Free last computed value; just for safety reasons.
	    */
	    xmlSchemaFreeValue(vctxt->value);
	    vctxt->value = NULL;
	}
	/*
	* Note that the attribute *use* can be unavailable, if
	* the attribute was a wild attribute.
	*/
	if ((iattr->decl->flags & XML_SCHEMAS_ATTR_FIXED) ||
	    ((iattr->use != NULL) &&
	     (iattr->use->flags & XML_SCHEMAS_ATTR_FIXED)))
	    fixed = 1;
	else
	    fixed = 0;
	/*
	* SPEC (cvc-attribute)
	* (3) "The item's `normalized value` must be locally `valid`
	* with respect to that {type definition} as per
	* String Valid ($3.14.4)."
	*
	* VAL TODO: Do we already have the
	* "normalized attribute value" here?
	*/
	if (xpathRes || fixed) {
	    iattr->flags |= XML_SCHEMA_NODE_INFO_VALUE_NEEDED;
	    /*
	    * Request a computed value.
	    */
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, &(iattr->val),
		1, 1, 0);
	} else {
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, NULL,
		1, 0, 0);
	}

	if (res != 0) {
	    if (res == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaStreamValidateSimpleTypeValue()");
		goto internal_error;
	    }
	    iattr->state = XML_SCHEMAS_ATTR_INVALID_VALUE;
	    /*
	    * SPEC PSVI Assessment Outcome (Attribute)
	    * [validity] = "invalid"
	    */
	    goto eval_idcs;
	}

	if (fixed) {
	    /*
	    * SPEC Attribute Locally Valid (Use) (cvc-au)
	    * "For an attribute information item to be `valid`
	    * with respect to an attribute use its *normalized*
	    * value must match the *canonical* lexical
	    * representation of the attribute use's {value
	    * constraint}value, if it is present and fixed."
	    *
	    * VAL TODO: The requirement for the *canonical* value
	    * will be removed in XML Schema 1.1.
	    */
	    /*
	    * SPEC Attribute Locally Valid (cvc-attribute)
	    * (4) "The item's *actual* value must match the *value* of
	    * the {value constraint}, if it is present and fixed."
	    */
	    if (iattr->val == NULL) {
		/* VAL TODO: A value was not precomputed. */
		goto eval_idcs;
	    }
	    if ((iattr->use != NULL) &&
		(iattr->use->defValue != NULL)) {
		if (iattr->use->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->use->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attr->use->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->use->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    } else {
		if (iattr->decl->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->decl->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attrDecl->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->decl->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    }
	    /*
	    * [validity] = "valid"
	    */
	}
eval_idcs:
	/*
	* Evaluate IDCs.
	*/
	if (xpathRes) {
	    if (xmlSchemaXPathProcessHistory(vctxt,
		vctxt->depth +1) == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	} else if (vctxt->xpathStates != NULL)
	    xmlSchemaXPathPop(vctxt);
    }

    /*
    * Report errors.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	if ((iattr->state == XML_SCHEMAS_ATTR_META) ||
	    (iattr->state == XML_SCHEMAS_ATTR_ASSESSED) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_SKIP) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL))
	    continue;
	ACTIVATE_ATTRIBUTE(iattr);
	switch (iattr->state) {
	    case XML_SCHEMAS_ATTR_ERR_MISSING: {
		    xmlChar *str = NULL;
		    ACTIVATE_ELEM;
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_4, NULL, NULL,
			"The attribute '%s' is required but missing",
			xmlSchemaFormatQName(&str,
			    iattr->decl->targetNamespace,
			    iattr->decl->name),
			NULL);
		    FREE_AND_NULL(str)
		    break;
		}
	    case XML_SCHEMAS_ATTR_ERR_NO_TYPE:
		VERROR(XML_SCHEMAV_CVC_ATTRIBUTE_2, NULL,
		    "The type definition is absent");
		break;
	    case XML_SCHEMAS_ATTR_ERR_FIXED_VALUE:
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_AU, NULL, NULL,
		    "The value '%s' does not match the fixed "
		    "value constraint '%s'",
		    iattr->value, iattr->vcValue);
		break;
	    case XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL:
		VERROR(XML_SCHEMAV_CVC_WILDCARD, NULL,
		    "No matching global attribute declaration available, but "
		    "demanded by the strict wildcard");
		break;
	    case XML_SCHEMAS_ATTR_UNKNOWN:
		if (iattr->metaType)
		    break;
		/*
		* MAYBE VAL TODO: One might report different error messages
		* for the following errors.
		*/
		if (type->attributeWildcard == NULL) {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1, iattr, NULL);
		} else {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2, iattr, NULL);
		}
		break;
	    default:
		break;
	}
    }

    ACTIVATE_ELEM;
    return (0);
internal_error:
    ACTIVATE_ELEM;
    return (-1);
}